

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O1

bool __thiscall
sptk::SymmetricMatrix::CholeskyDecomposition
          (SymmetricMatrix *this,SymmetricMatrix *lower_triangular_matrix,
          vector<double,_std::allocator<double>_> *diagonal_elements)

{
  pointer pdVar1;
  pointer ppdVar2;
  pointer ppdVar3;
  double *pdVar4;
  double *pdVar5;
  int j;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int j_1;
  ulong uVar9;
  bool bVar10;
  double dVar11;
  
  bVar10 = false;
  if (((this != lower_triangular_matrix) && (lower_triangular_matrix != (SymmetricMatrix *)0x0)) &&
     (diagonal_elements != (vector<double,_std::allocator<double>_> *)0x0)) {
    dVar11 = **(this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      if (lower_triangular_matrix->num_dimension_ != this->num_dimension_) {
        Resize(lower_triangular_matrix,this->num_dimension_);
      }
      if ((long)(diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)this->num_dimension_) {
        std::vector<double,_std::allocator<double>_>::resize
                  (diagonal_elements,(long)this->num_dimension_);
      }
      pdVar1 = (diagonal_elements->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      ppdVar2 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      *pdVar1 = **ppdVar2;
      ppdVar3 = (lower_triangular_matrix->index_).
                super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      **ppdVar3 = 1.0;
      uVar7 = (ulong)this->num_dimension_;
      bVar10 = (long)uVar7 < 2;
      if (1 < (long)uVar7) {
        uVar8 = 1;
        do {
          pdVar4 = ppdVar2[uVar8];
          pdVar5 = ppdVar3[uVar8];
          uVar6 = 0;
          do {
            dVar11 = pdVar4[uVar6];
            if (uVar6 != 0) {
              uVar9 = 0;
              do {
                dVar11 = dVar11 - ppdVar3[uVar6][uVar9] * ppdVar3[uVar8][uVar9] * pdVar1[uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar6 != uVar9);
            }
            pdVar5[uVar6] = dVar11 / pdVar1[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar8);
          dVar11 = ppdVar2[uVar8][uVar8];
          pdVar1[uVar8] = dVar11;
          pdVar4 = ppdVar3[uVar8];
          uVar6 = 0;
          do {
            dVar11 = dVar11 - pdVar4[uVar6] * pdVar4[uVar6] * pdVar1[uVar6];
            pdVar1[uVar8] = dVar11;
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
          if (ABS(pdVar1[uVar8]) <= 1e-12) {
            return bVar10;
          }
          ppdVar3[uVar8][uVar8] = 1.0;
          uVar8 = uVar8 + 1;
          bVar10 = uVar7 <= uVar8;
        } while (uVar8 != uVar7);
      }
    }
    else {
      bVar10 = false;
    }
  }
  return bVar10;
}

Assistant:

bool SymmetricMatrix::CholeskyDecomposition(
    SymmetricMatrix* lower_triangular_matrix,
    std::vector<double>* diagonal_elements) const {
  if (NULL == lower_triangular_matrix || NULL == diagonal_elements ||
      this == lower_triangular_matrix || 0.0 == index_[0][0]) {
    return false;
  }

  if (lower_triangular_matrix->num_dimension_ != num_dimension_) {
    lower_triangular_matrix->Resize(num_dimension_);
  }
  if (diagonal_elements->size() != static_cast<std::size_t>(num_dimension_)) {
    diagonal_elements->resize(num_dimension_);
  }

  double* d(&((*diagonal_elements)[0]));

  d[0] = index_[0][0];
  lower_triangular_matrix->index_[0][0] = 1.0;
  for (int i(1); i < num_dimension_; ++i) {
    for (int j(0); j < i; ++j) {
      double tmp(index_[i][j]);
      for (int k(0); k < j; ++k) {
        tmp -= lower_triangular_matrix->index_[i][k] *
               lower_triangular_matrix->index_[j][k] * d[k];
      }
      lower_triangular_matrix->index_[i][j] = tmp / d[j];
    }

    d[i] = index_[i][i];
    for (int j(0); j < i; ++j) {
      d[i] -= lower_triangular_matrix->index_[i][j] *
              lower_triangular_matrix->index_[i][j] * d[j];
    }
    if (std::fabs(d[i]) <= kMinimumValueOfDiagonalElement) {
      return false;
    }
    lower_triangular_matrix->index_[i][i] = 1.0;
  }
  return true;
}